

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

sz_sock __thiscall sznet::net::Connector::removeAndResetChannel(Connector *this)

{
  sz_sock sVar1;
  EventLoop *this_00;
  char *in_RSI;
  _Bind<void_(sznet::net::Connector::*(sznet::net::Connector_*))()> local_58;
  Functor local_40;
  
  Channel::disableAll((this->m_channel)._M_t.
                      super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                      .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl);
  Channel::remove((this->m_channel)._M_t.
                  super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                  .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl,in_RSI);
  this_00 = this->m_loop;
  sVar1 = ((this->m_channel)._M_t.
           super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
           _M_t.
           super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
           super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl)->m_fd;
  local_58._M_f = (offset_in_Connector_to_subr)resetChannel;
  local_58._8_8_ = 0;
  local_58._M_bound_args.super__Tuple_impl<0UL,_sznet::net::Connector_*>.
  super__Head_base<0UL,_sznet::net::Connector_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_sznet::net::Connector_*>)(_Tuple_impl<0UL,_sznet::net::Connector_*>)this;
  std::function<void()>::
  function<std::_Bind<void(sznet::net::Connector::*(sznet::net::Connector*))()>,void>
            ((function<void()> *)&local_40,&local_58);
  EventLoop::queueInLoop(this_00,&local_40);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return sVar1;
}

Assistant:

sockets::sz_sock Connector::removeAndResetChannel()
{
	m_channel->disableAll();
	m_channel->remove();
	sockets::sz_sock sockfd = m_channel->fd();
	// Can't reset m_channel here, because we are inside Channel::handleEvent
	// FIXME: unsafe
	m_loop->queueInLoop(std::bind(&Connector::resetChannel, this));
	return sockfd;
}